

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref cashew::ValueBuilder::makeNew(Ref call)

{
  Value *pVVar1;
  Ref r;
  Ref local_20;
  Ref local_18;
  Ref call_local;
  
  local_18.inst = call.inst;
  local_20 = makeRawArray(2);
  pVVar1 = Ref::operator->(&local_20);
  r = makeRawString((IString *)&NEW);
  pVVar1 = Value::push_back(pVVar1,r);
  pVVar1 = Value::push_back(pVVar1,local_18);
  Ref::Ref(&call_local,pVVar1);
  return (Ref)call_local.inst;
}

Assistant:

static Ref makeNew(Ref call) {
    return &makeRawArray(2)->push_back(makeRawString(NEW)).push_back(call);
  }